

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::TransformNode> *node,ssize_t id)

{
  long lVar1;
  long *plVar2;
  int in_EDX;
  long *in_RSI;
  XMLWriter *in_RDI;
  size_t i;
  AffineSpace3fa *in_stack_fffffffffffffbc0;
  allocator *paVar3;
  char *in_stack_fffffffffffffbc8;
  XMLWriter *in_stack_fffffffffffffbd0;
  allocator local_3e1;
  string local_3e0 [32];
  long *local_3c0;
  Node *local_3b8;
  Node *pNStack_3b0;
  Node *local_3a8;
  Node *pNStack_3a0;
  Node *local_398;
  Node *pNStack_390;
  Node *local_388;
  Node *pNStack_380;
  ulong local_378;
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  long *local_320;
  undefined8 local_318 [2];
  undefined8 local_308 [2];
  undefined8 local_2f8 [6];
  allocator local_2c1;
  string local_2c0 [32];
  int local_2a0;
  long **local_288;
  long **local_278;
  long local_238;
  long local_230;
  ulong local_228;
  long local_220;
  undefined8 local_218;
  long local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  Ref<embree::SceneGraph::Node> *local_1f8;
  XMLWriter *local_1f0;
  long *local_1e8;
  long **local_1e0;
  long *local_1d8;
  long **local_1d0;
  long local_1c8;
  long local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  ulong local_1a8;
  long local_1a0;
  Ref<embree::SceneGraph::Node> *local_198;
  XMLWriter *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f0;
  Ref<embree::SceneGraph::Node> *local_e8;
  Node **local_e0;
  Node *local_d8;
  Node *pNStack_d0;
  Node **local_c0;
  Ref<embree::SceneGraph::Node> *local_b8;
  Node **local_b0;
  Node *local_a8;
  Node *pNStack_a0;
  Node **local_90;
  Ref<embree::SceneGraph::Node> *in_stack_ffffffffffffff78;
  XMLWriter *in_stack_ffffffffffffff80;
  
  lVar1 = *in_RSI;
  local_230 = lVar1 + 0x68;
  local_1c8 = lVar1 + 0x70;
  local_2a0 = in_EDX;
  if (*(long *)(lVar1 + 0x78) == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"Transform",&local_2c1);
    open(in_RDI,(char *)local_2c0,local_2a0);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    lVar1 = *in_RSI;
    local_210 = lVar1 + 0x68;
    local_218 = 0;
    local_1b0 = lVar1 + 0x70;
    local_1b8 = 0;
    local_208 = *(undefined8 **)(lVar1 + 0x88);
    local_200 = local_318;
    local_108 = *local_208;
    uStack_100 = local_208[1];
    local_140 = local_308;
    local_148 = local_208 + 2;
    local_138 = *local_148;
    uStack_130 = local_208[3];
    local_170 = local_2f8;
    local_178 = local_208 + 4;
    local_168 = *local_178;
    uStack_160 = local_208[5];
    local_2f8[2] = local_208[6];
    local_2f8[3] = local_208[7];
    local_188 = local_208;
    local_180 = local_200;
    local_150 = local_170;
    local_120 = local_140;
    local_118 = local_208;
    local_110 = local_200;
    local_f0 = local_200;
    local_318[0] = local_108;
    local_318[1] = uStack_100;
    local_308[0] = local_138;
    local_308[1] = uStack_130;
    local_2f8[0] = local_168;
    local_2f8[1] = uStack_160;
    store(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    local_1e8 = (long *)(*in_RSI + 0x98);
    local_1e0 = &local_320;
    local_320 = (long *)*local_1e8;
    if (local_320 != (long *)0x0) {
      (**(code **)(*local_320 + 0x10))();
    }
    store(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_288 = &local_320;
    if (local_320 != (long *)0x0) {
      (**(code **)(*local_320 + 0x18))();
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_340,"Transform",&local_341);
    close(in_RDI,(int)local_340);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,"TransformAnimation",&local_369);
    open(in_RDI,(char *)local_368,local_2a0);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    local_378 = 0;
    while( true ) {
      lVar1 = *in_RSI;
      local_238 = lVar1 + 0x68;
      local_1c0 = lVar1 + 0x70;
      if (*(ulong *)(lVar1 + 0x78) <= local_378) break;
      lVar1 = *in_RSI;
      local_220 = lVar1 + 0x68;
      local_228 = local_378;
      local_1a0 = lVar1 + 0x70;
      local_1a8 = local_378;
      local_1f8 = (Ref<embree::SceneGraph::Node> *)(*(long *)(lVar1 + 0x88) + local_378 * 0x40);
      local_1f0 = (XMLWriter *)&local_3b8;
      local_3b8 = local_1f8->ptr;
      pNStack_3b0 = local_1f8[1].ptr;
      local_b0 = &local_3a8;
      local_b8 = local_1f8 + 2;
      local_a8 = local_b8->ptr;
      pNStack_a0 = local_1f8[3].ptr;
      local_e0 = &local_398;
      local_e8 = local_1f8 + 4;
      local_d8 = local_e8->ptr;
      pNStack_d0 = local_1f8[5].ptr;
      local_388 = local_1f8[6].ptr;
      pNStack_380 = local_1f8[7].ptr;
      local_198 = local_1f8;
      local_190 = local_1f0;
      local_c0 = local_e0;
      local_90 = local_b0;
      in_stack_ffffffffffffff78 = local_1f8;
      in_stack_ffffffffffffff80 = local_1f0;
      local_3a8 = local_a8;
      pNStack_3a0 = pNStack_a0;
      local_398 = local_d8;
      pNStack_390 = pNStack_d0;
      store(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
      local_378 = local_378 + 1;
    }
    local_1d8 = (long *)(*in_RSI + 0x98);
    local_1d0 = &local_3c0;
    plVar2 = (long *)*local_1d8;
    if (plVar2 != (long *)0x0) {
      lVar1 = *local_3c0;
      local_3c0 = plVar2;
      (**(code **)(lVar1 + 0x10))();
      plVar2 = local_3c0;
    }
    local_3c0 = plVar2;
    store(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_278 = &local_3c0;
    if (local_3c0 != (long *)0x0) {
      (**(code **)(*local_3c0 + 0x18))();
    }
    paVar3 = &local_3e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"TransformAnimation",paVar3);
    close(in_RDI,(int)local_3e0);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::TransformNode> node, ssize_t id)
  {
    if (node->spaces.size() == 1)
    {
      open("Transform",id);
      store("AffineSpace",node->spaces[0]);
      store(node->child);
      close("Transform");
    }
    else 
    {
      open("TransformAnimation",id);
      for (size_t i=0; i<node->spaces.size(); i++)
        store("AffineSpace",node->spaces[i]);
      store(node->child);
      close("TransformAnimation");
    }
  }